

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall google::LogMessage::~LogMessage(LogMessage *this)

{
  long lVar1;
  LogMessageData *pLVar2;
  long *in_FS_OFFSET;
  
  Flush(this);
  lVar1 = *in_FS_OFFSET;
  if (this->data_ != (LogMessageData *)(lVar1 + -0x7730)) {
    pLVar2 = this->allocated_;
    if (pLVar2 != (LogMessageData *)0x0) {
      LogStream::~LogStream(&pLVar2->stream_);
    }
    operator_delete(pLVar2,0x7730);
    return;
  }
  LogStream::~LogStream(&this->data_->stream_);
  *(undefined1 *)(lVar1 + -0x7738) = 1;
  return;
}

Assistant:

LogMessage::~LogMessage() {
  Flush();
#ifdef GLOG_THREAD_LOCAL_STORAGE
  if (data_ == static_cast<void*>(&thread_msg_data)) {
    data_->~LogMessageData();
    thread_data_available = true;
  }
  else {
    delete allocated_;
  }
#else // !defined(GLOG_THREAD_LOCAL_STORAGE)
  delete allocated_;
#endif // defined(GLOG_THREAD_LOCAL_STORAGE)
}